

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsPrehistorikTrack(Track *track)

{
  int iVar1;
  pointer pSVar2;
  pointer puVar3;
  bool bVar4;
  vector<Sector,_std::allocator<Sector>_> *pvVar5;
  Data *pDVar6;
  byte bVar7;
  Sector *s;
  pointer this;
  bool bVar8;
  
  pvVar5 = Track::sectors(track);
  this = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pSVar2 = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = this == pSVar2;
  if (bVar8) {
    bVar8 = false;
  }
  else {
    bVar7 = 0;
    do {
      bVar4 = false;
      if ((this->datarate == _250K) && (bVar4 = false, this->encoding == MFM)) {
        iVar1 = (this->header).size;
        bVar4 = Sector::has_baddatacrc(this);
        if (iVar1 == (uint)bVar4 + (uint)bVar4 * 2 + 2) {
          bVar4 = true;
          if (((this->header).sector == 0xc) && ((this->header).size == 5)) {
            pDVar6 = Sector::data_copy(this,0);
            puVar3 = (pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar4 = puVar3[0x1f] == 's' && *(int *)(puVar3 + 0x1b) == 0x75746954;
            bVar7 = 1;
          }
        }
        else {
          bVar4 = false;
        }
      }
      if (!bVar4) break;
      this = this + 1;
      bVar8 = this == pSVar2;
    } while (!bVar8);
    bVar8 = (bool)(bVar8 & bVar7);
  }
  if ((bVar8 != false) && (opt.debug != 0)) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [28])"detected Prehistorik track\n");
  }
  return bVar8;
}

Assistant:

bool IsPrehistorikTrack(const Track& track)
{
    bool found_12{ false };

    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.size != (s.has_baddatacrc() ? 5 : 2))
            return false;

        // The 4K sector 12 contains the protection signature.
        if (s.header.sector == 12 && s.header.size == 5)
        {
            found_12 = true;

            auto& data12 = s.data_copy();
            if (memcmp(data12.data() + 0x1b, "Titus", 5))
                return false;
        }
    }

    if (!found_12)
        return false;

    if (opt.debug) util::cout << "detected Prehistorik track\n";
    return true;
}